

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

bool __thiscall slang::driver::Driver::reportParseDiags(Driver *this)

{
  int iVar1;
  pointer psVar2;
  element_type *peVar3;
  Diagnostic *pDVar4;
  _Alloc_hider ctx;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  long lVar5;
  Diagnostic *diag;
  pointer diagnostic;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  pointer psVar6;
  format_args args;
  string_view fmt;
  string_view text;
  Diagnostics diags;
  string local_168;
  string local_148;
  pointer local_128;
  size_type sStack_120;
  Diagnostics local_118;
  
  local_118.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.data_
       = (pointer)local_118.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_118.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len =
       0;
  local_118.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap =
       2;
  psVar6 = (this->sourceLoader).libraryMapTrees.
           super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->sourceLoader).libraryMapTrees.
           super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar2) {
    do {
      peVar3 = (psVar6->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      pDVar4 = (peVar3->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
               super_SmallVectorBase<slang::Diagnostic>.data_;
      SmallVectorBase<slang::Diagnostic>::append<const_slang::Diagnostic_*>
                ((SmallVectorBase<slang::Diagnostic> *)&local_118,pDVar4,
                 pDVar4 + (peVar3->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
                          super_SmallVectorBase<slang::Diagnostic>.len);
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar2);
  }
  psVar6 = (this->syntaxTrees).
           super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->syntaxTrees).
           super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar2) {
    do {
      peVar3 = (psVar6->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      pDVar4 = (peVar3->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
               super_SmallVectorBase<slang::Diagnostic>.data_;
      SmallVectorBase<slang::Diagnostic>::append<const_slang::Diagnostic_*>
                ((SmallVectorBase<slang::Diagnostic> *)&local_118,pDVar4,
                 pDVar4 + (peVar3->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
                          super_SmallVectorBase<slang::Diagnostic>.len);
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar2);
  }
  Diagnostics::sort(&local_118,&this->sourceManager);
  if (local_118.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
      len != 0) {
    lVar5 = local_118.super_SmallVector<slang::Diagnostic,_2UL>.
            super_SmallVectorBase<slang::Diagnostic>.len * 0x70;
    diagnostic = local_118.super_SmallVector<slang::Diagnostic,_2UL>.
                 super_SmallVectorBase<slang::Diagnostic>.data_;
    do {
      DiagnosticEngine::issue(&this->diagEngine,diagnostic);
      diagnostic = diagnostic + 1;
      lVar5 = lVar5 + -0x70;
    } while (lVar5 != 0);
  }
  TextDiagnosticClient::getString_abi_cxx11_
            (&local_148,
             (this->textDiagClient).
             super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_128 = local_148._M_dataplus._M_p;
  sStack_120 = local_148._M_string_length;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_128;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x2;
  ::fmt::v11::vformat_abi_cxx11_(&local_168,(v11 *)0x49a1f9,fmt,args);
  text._M_str = local_168._M_dataplus._M_p;
  text._M_len = local_168._M_string_length;
  ctx._M_p = local_168._M_dataplus._M_p;
  OS::printE(text);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    ctx._M_p = (pointer)(local_168.field_2._M_allocated_capacity + 1);
    operator_delete(local_168._M_dataplus._M_p,(size_t)ctx._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    ctx._M_p = (pointer)(local_148.field_2._M_allocated_capacity + 1);
    operator_delete(local_148._M_dataplus._M_p,(size_t)ctx._M_p);
  }
  iVar1 = (this->diagEngine).numErrors;
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_118,(EVP_PKEY_CTX *)ctx._M_p);
  return iVar1 == 0;
}

Assistant:

bool Driver::reportParseDiags() {
    Diagnostics diags;
    for (auto& tree : sourceLoader.getLibraryMaps())
        diags.append_range(tree->diagnostics());
    for (auto& tree : syntaxTrees)
        diags.append_range(tree->diagnostics());

    diags.sort(sourceManager);
    for (auto& diag : diags)
        diagEngine.issue(diag);

    OS::printE(fmt::format("{}", textDiagClient->getString()));
    return diagEngine.getNumErrors() == 0;
}